

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

VectorXd * __thiscall
ChebTools::ChebyshevLobattoNodesLibrary::get(ChebyshevLobattoNodesLibrary *this,size_t N)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  
  p_Var1 = &(this->vectors)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->vectors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < N]) {
    if (*(ulong *)(p_Var3 + 1) >= N) {
      p_Var2 = p_Var3;
    }
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) && (p_Var3 = p_Var2, N < *(ulong *)(p_Var2 + 1))) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    build(this,N);
    p_Var3 = (this->vectors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var1->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < N]) {
      if (*(ulong *)(p_Var3 + 1) >= N) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var1) && (*(ulong *)(p_Var2 + 1) <= N)) {
      p_Var3 = p_Var2;
    }
  }
  return (VectorXd *)&p_Var3[1]._M_parent;
}

Assistant:

const Eigen::VectorXd & get(std::size_t N) {
            auto it = vectors.find(N);
            if (it != vectors.end()) {
                return it->second;
            }
            else {
                build(N);
                return vectors.find(N)->second;
            }
        }